

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O0

string * __thiscall base_uint<256u>::GetHex_abi_cxx11_(base_uint<256U> *this)

{
  long lVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  int x;
  base_blob<256U> b;
  string *ptr;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptr = in_RDI;
  base_blob<256U>::base_blob((base_blob<256U> *)in_RDI);
  for (iVar2 = 0; iVar2 < 8; iVar2 = iVar2 + 1) {
    base_blob<256U>::begin((base_blob<256U> *)in_RDI);
    ::WriteLE32((uchar *)ptr,(uint32_t)((ulong)in_RDI >> 0x20));
  }
  base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ptr;
  }
  __stack_chk_fail();
}

Assistant:

std::string base_uint<BITS>::GetHex() const
{
    base_blob<BITS> b;
    for (int x = 0; x < this->WIDTH; ++x) {
        WriteLE32(b.begin() + x*4, this->pn[x]);
    }
    return b.GetHex();
}